

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMLSSerializerImpl::setParameter(DOMLSSerializerImpl *this,XMLCh *featName,bool state)

{
  DOMException *this_00;
  uint uVar1;
  int featureId;
  
  featureId = -1;
  checkFeature(this,featName,true,&featureId);
  if (featuresSupported[(int)((uint)!state + featureId * 2)] == '\0') {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,9,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  uVar1 = 1 << ((byte)featureId & 0x1f);
  if (state) {
    uVar1 = uVar1 | this->fFeatures;
    this->fFeatures = uVar1;
    if (featureId == 0) {
      uVar1 = uVar1 & 0xfffff9f5;
      goto LAB_0028b950;
    }
  }
  else {
    uVar1 = ~uVar1 & this->fFeatures;
    this->fFeatures = uVar1;
  }
  if (9 < (uint)featureId) {
    return;
  }
  if ((0x20aU >> (featureId & 0x1fU) & 1) == 0) {
    return;
  }
  if (!state) {
    return;
  }
  uVar1 = uVar1 & 0xfffffffe;
LAB_0028b950:
  this->fFeatures = uVar1;
  return;
}

Assistant:

void DOMLSSerializerImpl::setParameter(const XMLCh* featName
                                     , bool         state)
{
    int featureId = INVALID_FEATURE_ID;
    checkFeature(featName, true, featureId);

    if (!canSetFeature(featureId, state))
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, fMemoryManager);

    setFeature(featureId, state);

    //
    // setting "canonical-form" to true will set the parameters "format-pretty-print",
    // "discard-default-content", and "xml-declaration", to false
    //
    if ((featureId == CANONICAL_FORM_ID) && state)
    {
        setFeature(FORMAT_PRETTY_PRINT_ID, false);
        setFeature(FORMAT_PRETTY_PRINT_1ST_LEVEL_ID, false);
        setFeature(DISCARD_DEFAULT_CONTENT_ID, false);
        setFeature(XML_DECLARATION, false);
    }
    // Setting one of those parameters to true will set "canonical-form" to false.
    if ((featureId == FORMAT_PRETTY_PRINT_ID || featureId == DISCARD_DEFAULT_CONTENT_ID || featureId == XML_DECLARATION) && state)
        setFeature(CANONICAL_FORM_ID, false);
}